

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int SHA1_Final(uchar *md,SHA_CTX *c)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint8_t finalcount [8];
  
  bVar1 = 0;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    finalcount[uVar3] = (uint8_t)(c->data[(ulong)(uVar3 < 4) - 2] >> (~bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  SHA1_Update(c,anon_var_dwarf_3ed40,1);
  while ((c->Nl & 0x1f8) != 0x1c0) {
    SHA1_Update(c,"",1);
  }
  SHA1_Update(c,finalcount,8);
  iVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x14; uVar3 = uVar3 + 1) {
    md[uVar3] = (uchar)(*(uint *)((long)c->data + ((uVar3 & 0xfffffffffffffffc) - 0x1c)) >>
                       (~(byte)iVar2 & 0x18));
    iVar2 = iVar2 + 8;
  }
  return iVar2;
}

Assistant:

void SHA1_Final(uint8_t digest[20], SHA1_CTX *context)
{
  size_t i;
  uint8_t finalcount[8];

  for (i = 0; i < 8; i++) {
    finalcount[i] = (uint8_t) ((context->count[(i >= 4 ? 0 : 1)]
                    >> ((3 - (i & 3)) * 8)) & 255); /* Endian independent */
  }
  SHA1_Update(context, (uint8_t *) "\x80", 1);
  while ((context->count[0] & 504) != 448)
    SHA1_Update(context, (uint8_t *) "\0", 1);
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] =
      (uint8_t)((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
  }
}